

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::strtonum::parse<unsigned_long>(void *param_1,unsigned_long_long *param_2)

{
  int *piVar1;
  unsigned_long_long uVar2;
  unsigned_long_long x;
  char *endptr;
  bool local_2b;
  long local_20;
  unsigned_long_long *local_18;
  void *local_10;
  
  local_20 = 0;
  local_18 = param_2;
  local_10 = param_1;
  piVar1 = __errno_location();
  *piVar1 = 0;
  uVar2 = parse_integral((strtonum *)param_1,&local_20);
  *local_18 = uVar2;
  local_2b = false;
  if (uVar2 == *local_18) {
    piVar1 = __errno_location();
    local_2b = false;
    if ((*piVar1 == 0) && (local_2b = false, *param_1 < *(ulong *)((long)param_1 + 8))) {
      local_2b = local_20 == *(long *)((long)param_1 + 8);
    }
  }
  return local_2b;
}

Assistant:

bool parse(T& value, /*is_integral=*/std::true_type) const
            {
                char* endptr = nullptr;
                errno = 0; // these are thread-local
                const auto x = parse_integral(&endptr, std::is_signed<T>());

                // called right overload?
                static_assert(std::is_signed<T>() == std::is_signed<decltype(x)>(), "");

                value = static_cast<T>(x);

                return (x == static_cast<decltype(x)>(value)) // x fits into destination T
                       and (x < 0) == (value < 0)             // preserved sign
                       //and ((x != 0) or is_integral())        // strto[u]ll did nto fail
                       and (errno == 0)                       // strto[u]ll did not overflow
                       and (m_start < m_end)                  // token was not empty
                       and (endptr == m_end);                 // parsed entire token exactly
            }